

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

string * bsim::hex_digit_to_binary_abi_cxx11_(char hex_digit)

{
  undefined1 in_SIL;
  string *in_RDI;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [19];
  allocator local_a [10];
  
  switch(in_SIL) {
  case 0x30:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"0000",local_a);
    std::allocator<char>::~allocator((allocator<char> *)local_a);
    break;
  case 0x31:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"0001",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 0x32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"0010",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 0x33:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"0011",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 0x34:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"0100",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 0x35:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"0101",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 0x36:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"0110",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 0x37:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"0111",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  case 0x38:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1000",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
    break;
  case 0x39:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1001",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x41,"std::string bsim::hex_digit_to_binary(const char)");
  case 0x61:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1010",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0x62:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1011",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 99:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1100",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 100:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1101",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 0x65:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1110",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 0x66:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1111",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 0x78:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"xxxx",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 0x7a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"zzzz",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  }
  return in_RDI;
}

Assistant:

static std::string hex_digit_to_binary(const char hex_digit) {
    switch (hex_digit) {
    case '0':
      return "0000";
    case '1':
      return "0001";
    case '2':
      return "0010";
    case '3':
      return "0011";
    case '4':
      return "0100";
    case '5':
      return "0101";
    case '6':
      return "0110";
    case '7':
      return "0111";
    case '8':
      return "1000";
    case '9':
      return "1001";
    case 'a':
      return "1010";
    case 'b':
      return "1011";
    case 'c':
      return "1100";
    case 'd':
      return "1101";
    case 'e':
      return "1110";
    case 'f':
      return "1111";
    case 'x':
      return "xxxx";
    case 'z':
      return "zzzz";
      
    default:
      assert(false);
    }

    assert(false);
  }